

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O0

void __thiscall
IRC_Bot::IRC_Bot(IRC_Bot *this,Config *in_primary_section,Config *in_secondary_section)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  IRCCommand *local_88;
  reference local_80;
  IRCCommand **command;
  iterator __end1;
  iterator __begin1;
  vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *__range1;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Config *local_20;
  Config *in_secondary_section_local;
  Config *in_primary_section_local;
  IRC_Bot *this_local;
  
  local_20 = in_secondary_section;
  in_secondary_section_local = in_primary_section;
  in_primary_section_local = (Config *)this;
  Jupiter::IRC::Client::Client(&this->super_Client,in_primary_section,in_secondary_section);
  *(undefined ***)this = &PTR_think_00157aa0;
  std::
  vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
  ::vector(&this->m_commands);
  std::__cxx11::string::string((string *)&this->m_commandPrefix);
  local_40 = sv("Prefix",6);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50);
  local_30 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::IRC::Client::readConfigValue
                       (this,local_40._M_len,local_40._M_str,local_50._M_len,local_50._M_str);
  std::__cxx11::string::operator=((string *)&this->m_commandPrefix,&local_30);
  __end1 = std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::begin(&g_IRCMasterCommandList);
  command = (IRCCommand **)
            std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::end(&g_IRCMasterCommandList);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>
                      (&__end1,(__normal_iterator<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>
                                *)&command);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_80 = __gnu_cxx::
               __normal_iterator<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>
               ::operator*(&__end1);
    iVar2 = (*((*local_80)->super_Command)._vptr_Command[5])();
    local_88 = (IRCCommand *)CONCAT44(extraout_var,iVar2);
    std::
    vector<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>,std::allocator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>>>
    ::emplace_back<IRCCommand*>
              ((vector<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>,std::allocator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>>>
                *)&this->m_commands,&local_88);
    __gnu_cxx::
    __normal_iterator<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>::
    operator++(&__end1);
  }
  setCommandAccessLevels(this,(IRCCommand *)0x0);
  return;
}

Assistant:

IRC_Bot::IRC_Bot(Jupiter::Config *in_primary_section, Jupiter::Config *in_secondary_section)
	: Client(in_primary_section, in_secondary_section) {
	m_commandPrefix = this->readConfigValue("Prefix"sv);
	
	for (const auto& command : IRCMasterCommandList) {
		m_commands.emplace_back(command->copy());
	}

	setCommandAccessLevels();
}